

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Statement> __thiscall Parser::tryCatchStatement(Parser *this)

{
  pointer pcVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Parser *in_RSI;
  ptr<Statement> pVar4;
  ptr<StatementBlock> tryBlock;
  Identifier identifier;
  ptr<StatementBlock> catchBlock;
  undefined1 local_a9;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88;
  undefined7 uStack_87;
  _Alloc_hider local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_48;
  unsigned_long local_38;
  _Alloc_hider _Stack_30;
  
  consume(in_RSI);
  statementBlock((Parser *)local_a8);
  consume(in_RSI,Catch,"\'catch\'");
  local_98._8_8_ = 0;
  local_88 = 0;
  local_98._M_allocated_capacity = (size_type)(local_a8 + 0x20);
  bVar2 = match(in_RSI,Identifier);
  if (bVar2) {
    local_60._0_4_ = (in_RSI->currentToken).type;
    pcVar1 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
    local_58._M_pi = &local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + (in_RSI->currentToken).lexeme._M_string_length);
    local_38 = (in_RSI->currentToken).line;
    _Stack_30._M_p = (pointer)(in_RSI->currentToken).col;
    std::__cxx11::string::operator=((string *)(local_a8 + 0x10),(string *)&local_58);
    if (local_58._M_pi != &local_48) {
      operator_delete(local_58._M_pi,(long)local_48._vptr__Sp_counted_base + 1);
    }
    consume(in_RSI);
  }
  statementBlock((Parser *)local_60);
  local_78._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TryCatchStatement,std::allocator<TryCatchStatement>,std::__cxx11::string&,std::shared_ptr<StatementBlock>&,std::shared_ptr<StatementBlock>&>
            (a_Stack_70,(TryCatchStatement **)&local_78,(allocator<TryCatchStatement> *)&local_a9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10),
             (shared_ptr<StatementBlock> *)local_a8,(shared_ptr<StatementBlock> *)local_60);
  (this->filepath)._M_dataplus._M_p = local_78._M_p;
  (this->filepath)._M_string_length = (size_type)a_Stack_70[0]._M_pi;
  _Var3._M_pi = extraout_RDX;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  if ((undefined1 *)local_98._M_allocated_capacity != local_a8 + 0x20) {
    operator_delete((void *)local_98._M_allocated_capacity,CONCAT71(uStack_87,local_88) + 1);
    _Var3._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    _Var3._M_pi = extraout_RDX_02;
  }
  pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::tryCatchStatement() {
    consume();

    ptr<StatementBlock> tryBlock = statementBlock();
    consume(TokenType::Catch, "'catch'");

    Identifier identifier;
    if(match(TokenType::Identifier)) {
        identifier = token().lexeme;
        consume();
    }

    ptr<StatementBlock> catchBlock = statementBlock();

    return make<TryCatchStatement>(identifier, tryBlock, catchBlock);
}